

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O3

void penguinV::LookupTable
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *table)

{
  bool bVar1;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar2;
  imageException *this_00;
  ImageTypeManager *pIVar3;
  LookupTableForm4 p_Var4;
  uint8_t uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ImageManager manager;
  
  this = ImageTypeManager::instance();
  pFVar2 = ImageTypeManager::functionTable(this,in->_type);
  p_Var4 = pFVar2->LookupTable;
  uVar5 = in->_type;
  if (p_Var4 != (LookupTableForm4)0x0) {
LAB_001299b3:
    manager._registrator = ImageTypeManager::instance();
    manager._input.
    super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    manager._input.
    super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    manager._input.
    super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    manager._output.
    super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    manager._output.
    super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    manager._output.
    super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    manager._inputClone.
    super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    manager._inputClone.
    super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    manager._inputClone.
    super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    manager._outputClone.
    super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    manager._outputClone.
    super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    manager._outputClone.
    super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    manager._type = uVar5;
    (*p_Var4)(in,startXIn,startYIn,out,startXOut,startYOut,width,height,table);
    anon_unknown.dwarf_d7bd2::ImageManager::~ImageManager(&manager);
    return;
  }
  bVar1 = ImageTypeManager::isIntertypeConversionEnabled(this);
  if (bVar1) {
    ImageTypeManager::imageTypes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&manager,this);
    pIVar3 = manager._registrator;
    if (manager._registrator ==
        (ImageTypeManager *)
        manager._input.
        super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      p_Var4 = (LookupTableForm4)0x0;
    }
    else {
      do {
        pFVar2 = ImageTypeManager::functionTable
                           (this,*(uint8_t *)&(pIVar3->_functionTableMap)._M_t._M_impl);
        p_Var4 = pFVar2->LookupTable;
        if (p_Var4 != (LookupTableForm4)0x0) {
          uVar5 = *(uint8_t *)&(pIVar3->_functionTableMap)._M_t._M_impl;
          break;
        }
        pIVar3 = (ImageTypeManager *)&(pIVar3->_functionTableMap)._M_t._M_impl.field_0x1;
      } while (pIVar3 != (ImageTypeManager *)
                         manager._input.
                         super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    if (manager._registrator != (ImageTypeManager *)0x0) {
      operator_delete(manager._registrator);
    }
    if (p_Var4 != (LookupTableForm4)0x0) goto LAB_001299b3;
  }
  local_100.field_2._M_allocated_capacity._0_7_ = 0x5470756b6f6f4c;
  local_100.field_2._7_4_ = 0x656c6261;
  local_100._M_string_length = 0xb;
  local_e0.field_2._M_allocated_capacity = 0x6e6f6974636e7546;
  local_e0.field_2._8_2_ = 0x20;
  local_e0._M_string_length = 9;
  local_100.field_2._M_local_buf[0xb] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::operator+(&local_c0,&local_e0,&local_100);
  local_120.field_2._M_allocated_capacity._0_7_ = 0x746f6e20736920;
  local_120.field_2._M_local_buf[7] = ' ';
  local_120.field_2._8_7_ = 0x64656e69666564;
  local_120._M_string_length = 0xf;
  local_120.field_2._M_local_buf[0xf] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&manager,
                 &local_c0,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,(char *)manager._registrator);
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void LookupTable ( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                       uint32_t width, uint32_t height, const std::vector < uint8_t > & table )
    {
        initialize( in, LookupTable )
        func( in, startXIn, startYIn, out, startXOut, startYOut, width, height, table );
    }